

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

real __thiscall fasttext::Vector::norm(Vector *this)

{
  float fVar1;
  undefined1 auVar2 [16];
  int64_t iVar3;
  float *pfVar4;
  AlignedVector<float> *in_RDI;
  double dVar5;
  int64_t i;
  real sum;
  undefined8 local_18;
  undefined4 local_c;
  
  local_c = 0;
  local_18 = 0;
  while( true ) {
    iVar3 = size((Vector *)0x1c3daa);
    if (iVar3 <= (long)local_18) break;
    pfVar4 = intgemm::AlignedVector<float>::operator[](in_RDI,local_18);
    fVar1 = *pfVar4;
    pfVar4 = intgemm::AlignedVector<float>::operator[](in_RDI,local_18);
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)*pfVar4),ZEXT416((uint)fVar1),ZEXT416(local_c));
    local_c = auVar2._0_4_;
    local_18 = local_18 + 1;
  }
  dVar5 = std::sqrt((double)(ulong)local_c);
  return SUB84(dVar5,0);
}

Assistant:

real Vector::norm() const {
  real sum = 0;
  for (int64_t i = 0; i < size(); i++) {
    sum += data_[i] * data_[i];
  }
  return std::sqrt(sum);
}